

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

Result __thiscall
wabt::WastParser::ParseModule
          (WastParser *this,unique_ptr<wabt::Module,_std::default_delete<wabt::Module>_> *out_module
          )

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar1;
  Result result;
  pointer pMVar2;
  type this_00;
  pointer module_00;
  size_type sVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_e0;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_bb;
  allocator local_ba;
  allocator local_b9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  string asStack_98 [32];
  iterator local_78;
  size_type local_70;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  Enum local_4c;
  _Type local_48;
  unique_ptr<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>_> local_40;
  unique_ptr<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>_> module_command;
  CommandPtr local_30;
  CommandPtr command;
  unique_ptr<wabt::Module,_std::default_delete<wabt::Module>_> module;
  unique_ptr<wabt::Module,_std::default_delete<wabt::Module>_> *out_module_local;
  WastParser *this_local;
  
  MakeUnique<wabt::Module>();
  bVar1 = PeekMatchLpar(this,Module);
  if (bVar1) {
    std::unique_ptr<wabt::Command,std::default_delete<wabt::Command>>::
    unique_ptr<std::default_delete<wabt::Command>,void>
              ((unique_ptr<wabt::Command,std::default_delete<wabt::Command>> *)&local_30);
    module_command._M_t.
    super___uniq_ptr_impl<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>_>._M_t.
    super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>.
    super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl._4_4_ =
         ParseModuleCommand(this,(Script *)0x0,&local_30);
    bVar1 = Failed(module_command._M_t.
                   super___uniq_ptr_impl<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>
                   .super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl._4_4_);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
    }
    else {
      cast<wabt::ModuleCommand,wabt::Command>((wabt *)&local_40,&local_30);
      pMVar2 = std::unique_ptr<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>_>::
               operator->(&local_40);
      this_00 = std::unique_ptr<wabt::Module,_std::default_delete<wabt::Module>_>::operator*
                          ((unique_ptr<wabt::Module,_std::default_delete<wabt::Module>_> *)&command)
      ;
      Module::operator=(this_00,&pMVar2->module);
      std::unique_ptr<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>_>::~unique_ptr
                (&local_40);
    }
    module_command._M_t.
    super___uniq_ptr_impl<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>_>._M_t.
    super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>.
    super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl._1_3_ = 0;
    module_command._M_t.
    super___uniq_ptr_impl<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>_>._M_t.
    super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>.
    super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl._0_1_ = bVar1;
    std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>::~unique_ptr(&local_30);
    if ((uint)module_command._M_t.
              super___uniq_ptr_impl<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>_>.
              _M_t.
              super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>
              .super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl != 0)
    goto LAB_0029c480;
  }
  else {
    local_48 = (_Type)PeekPair(this);
    bVar1 = anon_unknown_1::IsModuleField((TokenTypePair)local_48);
    if (bVar1) {
      module_00 = std::unique_ptr<wabt::Module,_std::default_delete<wabt::Module>_>::get
                            ((unique_ptr<wabt::Module,_std::default_delete<wabt::Module>_> *)
                             &command);
      local_4c = (Enum)ParseModuleFieldList(this,module_00);
      bVar1 = Failed((Result)local_4c);
      if (bVar1) {
        Result::Result((Result *)((long)&this_local + 4),Error);
        module_command._M_t.
        super___uniq_ptr_impl<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>_>._M_t.
        super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>.
        super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl._0_4_ = 1;
        goto LAB_0029c480;
      }
    }
    else {
      ConsumeIfLpar(this);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_b8,"a module field",&local_b9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(asStack_98,"a module",&local_ba);
      local_78 = &local_b8;
      local_70 = 2;
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      allocator(&local_bb);
      __l._M_len = local_70;
      __l._M_array = local_78;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_68,__l,&local_bb);
      ErrorExpected(this,&local_68,(char *)0x0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_68);
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~allocator(&local_bb);
      local_e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_78;
      do {
        local_e0 = local_e0 + -1;
        std::__cxx11::string::~string((string *)local_e0);
      } while (local_e0 != &local_b8);
      std::allocator<char>::~allocator((allocator<char> *)&local_ba);
      std::allocator<char>::~allocator((allocator<char> *)&local_b9);
    }
  }
  result = Expect(this,Eof);
  bVar1 = Failed(result);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
    module_command._M_t.
    super___uniq_ptr_impl<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>_>._M_t.
    super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>.
    super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl._0_4_ = 1;
  }
  else {
    sVar3 = std::vector<wabt::Error,_std::allocator<wabt::Error>_>::size(this->errors_);
    if (sVar3 == 0) {
      std::unique_ptr<wabt::Module,_std::default_delete<wabt::Module>_>::operator=
                (out_module,(unique_ptr<wabt::Module,_std::default_delete<wabt::Module>_> *)&command
                );
      Result::Result((Result *)((long)&this_local + 4),Ok);
      module_command._M_t.
      super___uniq_ptr_impl<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>_>._M_t.
      super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>.
      super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl._0_4_ = 1;
    }
    else {
      Result::Result((Result *)((long)&this_local + 4),Error);
      module_command._M_t.
      super___uniq_ptr_impl<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>_>._M_t.
      super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>.
      super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl._0_4_ = 1;
    }
  }
LAB_0029c480:
  std::unique_ptr<wabt::Module,_std::default_delete<wabt::Module>_>::~unique_ptr
            ((unique_ptr<wabt::Module,_std::default_delete<wabt::Module>_> *)&command);
  return (Result)this_local._4_4_;
}

Assistant:

Result WastParser::ParseModule(std::unique_ptr<Module>* out_module) {
  WABT_TRACE(ParseModule);
  auto module = MakeUnique<Module>();

  if (PeekMatchLpar(TokenType::Module)) {
    // Starts with "(module". Allow text and binary modules, but no quoted
    // modules.
    CommandPtr command;
    CHECK_RESULT(ParseModuleCommand(nullptr, &command));
    auto module_command = cast<ModuleCommand>(std::move(command));
    *module = std::move(module_command->module);
  } else if (IsModuleField(PeekPair())) {
    // Parse an inline module (i.e. one with no surrounding (module)).
    CHECK_RESULT(ParseModuleFieldList(module.get()));
  } else {
    ConsumeIfLpar();
    ErrorExpected({"a module field", "a module"});
  }

  EXPECT(Eof);
  if (errors_->size() == 0) {
    *out_module = std::move(module);
    return Result::Ok;
  } else {
    return Result::Error;
  }
}